

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O2

void __thiscall
CTxMemPool::addUnchecked(CTxMemPool *this,CTxMemPoolEntry *entry,setEntries *setAncestors)

{
  size_type *psVar1;
  long lVar2;
  CTransaction *pCVar3;
  pointer pCVar4;
  bool bVar5;
  int32_t iVar6;
  txiter it;
  _Base_ptr p_Var7;
  uint uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  pair<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_*,_bool>
  pVar10;
  CAmount delta;
  undefined1 local_98 [8];
  _Rb_tree_node_base local_90;
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  setParentTransactions;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pVar10 = boost::multi_index::
           multi_index_container<CTxMemPoolEntry,CTxMemPool::CTxMemPoolEntry_Indices,std::allocator<CTxMemPoolEntry>>
           ::emplace_<CTxMemPoolEntry::ExplicitCopyTag_const&,CTxMemPoolEntry_const&>
                     ((multi_index_container<CTxMemPoolEntry,CTxMemPool::CTxMemPoolEntry_Indices,std::allocator<CTxMemPoolEntry>>
                       *)&this->mapTx,(ExplicitCopyTag *)&CTxMemPoolEntry::ExplicitCopy,entry);
  it.node = pVar10.first;
  delta = 0;
  ApplyDelta(this,&(((entry->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped,&delta);
  if (delta != 0) {
    CTxMemPoolEntry::UpdateModifiedFee((CTxMemPoolEntry *)it.node,delta);
    bVar5 = boost::multi_index::detail::
            hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
            ::modify_(&(this->mapTx).super_type,it.node);
    if (!bVar5) {
      boost::multi_index::
      multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>
      ::delete_node_(&this->mapTx,it.node);
      psVar1 = &(this->mapTx).node_count;
      *psVar1 = *psVar1 - 1;
    }
  }
  this->cachedInnerUsage = this->cachedInnerUsage + entry->nUsageSize;
  pCVar3 = *(CTransaction **)
            &((it.node)->
             super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
             ).
             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
             .
             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
             .
             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
             .super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>.
             super_pod_value_holder<CTxMemPoolEntry>.space;
  setParentTransactions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &setParentTransactions._M_t._M_impl.super__Rb_tree_header._M_header;
  setParentTransactions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  setParentTransactions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  setParentTransactions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar8 = 0;
  setParentTransactions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       setParentTransactions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    uVar9 = (ulong)uVar8;
    pCVar4 = (pCVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(pCVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pCVar4) / 0x68) <= uVar9) break;
    local_98 = (undefined1  [8])(pCVar4 + uVar9);
    local_90._0_8_ = pCVar3;
    std::
    _Rb_tree<COutPoint_const*,std::pair<COutPoint_const*const,CTransaction_const*>,std::_Select1st<std::pair<COutPoint_const*const,CTransaction_const*>>,DereferencingComparator<COutPoint_const*>,std::allocator<std::pair<COutPoint_const*const,CTransaction_const*>>>
    ::_M_insert_unique<std::pair<COutPoint_const*const,CTransaction_const*>const&>
              ((_Rb_tree<COutPoint_const*,std::pair<COutPoint_const*const,CTransaction_const*>,std::_Select1st<std::pair<COutPoint_const*const,CTransaction_const*>>,DereferencingComparator<COutPoint_const*>,std::allocator<std::pair<COutPoint_const*const,CTransaction_const*>>>
                *)&this->mapNextTx,(pair<const_COutPoint_*const,_const_CTransaction_*> *)local_98);
    std::
    _Rb_tree<transaction_identifier<false>,transaction_identifier<false>,std::_Identity<transaction_identifier<false>>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>
    ::_M_insert_unique<transaction_identifier<false>const&>
              ((_Rb_tree<transaction_identifier<false>,transaction_identifier<false>,std::_Identity<transaction_identifier<false>>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>
                *)&setParentTransactions,
               (transaction_identifier<false> *)
               ((pCVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start + uVar9));
    uVar8 = uVar8 + 1;
  }
  GetIterSet((setEntries *)local_98,this,&setParentTransactions);
  for (p_Var7 = local_90._M_left; p_Var7 != &local_90;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    UpdateParent(this,it,*(hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                           **)(p_Var7 + 1),true);
  }
  std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)local_98);
  UpdateAncestorsOf(this,true,it,setAncestors);
  UpdateEntryForAncestors(this,it,setAncestors);
  LOCK();
  (this->nTransactionsUpdated).super___atomic_base<unsigned_int>._M_i =
       (this->nTransactionsUpdated).super___atomic_base<unsigned_int>._M_i + 1;
  UNLOCK();
  iVar6 = CTxMemPoolEntry::GetTxSize(entry);
  this->totalTxSize = this->totalTxSize + (long)iVar6;
  this->m_total_fee = this->m_total_fee + entry->nFee;
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)local_98,
             (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)it.node);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)&this->txns_randomized,(shared_ptr<const_CTransaction> *)local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_90);
  *(long *)((long)&((it.node)->
                   super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                   ).
                   super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                   .
                   super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                   .
                   super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                   .super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>.
                   super_pod_value_holder<CTxMemPoolEntry>.space + 0x100) =
       ((long)(this->txns_randomized).
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->txns_randomized).
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 4) + -1;
  std::
  _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::~_Rb_tree(&setParentTransactions._M_t);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CTxMemPool::addUnchecked(const CTxMemPoolEntry &entry, setEntries &setAncestors)
{
    // Add to memory pool without checking anything.
    // Used by AcceptToMemoryPool(), which DOES do
    // all the appropriate checks.
    indexed_transaction_set::iterator newit = mapTx.emplace(CTxMemPoolEntry::ExplicitCopy, entry).first;

    // Update transaction for any feeDelta created by PrioritiseTransaction
    CAmount delta{0};
    ApplyDelta(entry.GetTx().GetHash(), delta);
    // The following call to UpdateModifiedFee assumes no previous fee modifications
    Assume(entry.GetFee() == entry.GetModifiedFee());
    if (delta) {
        mapTx.modify(newit, [&delta](CTxMemPoolEntry& e) { e.UpdateModifiedFee(delta); });
    }

    // Update cachedInnerUsage to include contained transaction's usage.
    // (When we update the entry for in-mempool parents, memory usage will be
    // further updated.)
    cachedInnerUsage += entry.DynamicMemoryUsage();

    const CTransaction& tx = newit->GetTx();
    std::set<Txid> setParentTransactions;
    for (unsigned int i = 0; i < tx.vin.size(); i++) {
        mapNextTx.insert(std::make_pair(&tx.vin[i].prevout, &tx));
        setParentTransactions.insert(tx.vin[i].prevout.hash);
    }
    // Don't bother worrying about child transactions of this one.
    // Normal case of a new transaction arriving is that there can't be any
    // children, because such children would be orphans.
    // An exception to that is if a transaction enters that used to be in a block.
    // In that case, our disconnect block logic will call UpdateTransactionsFromBlock
    // to clean up the mess we're leaving here.

    // Update ancestors with information about this tx
    for (const auto& pit : GetIterSet(setParentTransactions)) {
            UpdateParent(newit, pit, true);
    }
    UpdateAncestorsOf(true, newit, setAncestors);
    UpdateEntryForAncestors(newit, setAncestors);

    nTransactionsUpdated++;
    totalTxSize += entry.GetTxSize();
    m_total_fee += entry.GetFee();

    txns_randomized.emplace_back(newit->GetSharedTx());
    newit->idx_randomized = txns_randomized.size() - 1;

    TRACE3(mempool, added,
        entry.GetTx().GetHash().data(),
        entry.GetTxSize(),
        entry.GetFee()
    );
}